

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O3

void anon_unknown.dwarf_31af3b3::AddFile(CSHA512 *hasher,char *path)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  int f;
  uchar fbuf [4096];
  stat sb;
  
  fbuf[0xa0] = '\0';
  fbuf[0xa1] = '\0';
  fbuf[0xa2] = '\0';
  fbuf[0xa3] = '\0';
  fbuf[0xa4] = '\0';
  fbuf[0xa5] = '\0';
  fbuf[0xa6] = '\0';
  fbuf[0xa7] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&sb,0,0x90);
  f = open(path,0);
  if (f != -1) {
    CSHA512::Write(hasher,(uchar *)&f,4);
    iVar2 = fstat(f,(stat *)&sb);
    if (iVar2 == 0) {
      CSHA512::Write(hasher,(uchar *)&sb,0x90);
    }
    uVar4 = 0;
    do {
      uVar3 = read(f,fbuf,0x1000);
      uVar5 = (uint)uVar3;
      if (0 < (int)uVar5) {
        CSHA512::Write(hasher,fbuf,(ulong)(uVar5 & 0x7fffffff));
      }
    } while (((uVar3 & 0xffffffff) == 0x1000) &&
            (uVar4 = uVar4 + (long)(int)uVar5, uVar4 < 0x100000));
    close(f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddFile(CSHA512& hasher, const char *path)
{
    struct stat sb = {};
    int f = open(path, O_RDONLY);
    size_t total = 0;
    if (f != -1) {
        unsigned char fbuf[4096];
        int n;
        hasher.Write((const unsigned char*)&f, sizeof(f));
        if (fstat(f, &sb) == 0) hasher << sb;
        do {
            n = read(f, fbuf, sizeof(fbuf));
            if (n > 0) hasher.Write(fbuf, n);
            total += n;
            /* not bothering with EINTR handling. */
        } while (n == sizeof(fbuf) && total < 1048576); // Read only the first 1 Mbyte
        close(f);
    }
}